

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_system.cpp
# Opt level: O3

int main(int argc,char **argv,char **env)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  ostream *poVar7;
  runtime_error *prVar8;
  char cVar9;
  char **ppcVar10;
  string command;
  string key;
  string example;
  string value;
  wstring wexample;
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  long *local_248 [2];
  long local_238 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208 [32];
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  ostringstream local_1a8 [376];
  
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,anon_var_dwarf_4026,anon_var_dwarf_4026 + 8);
  local_1c8[0] = local_1b8;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1c8,L"ש-м-ν",L"");
  if (argc == 2) {
    if (*argv[1] == '-') {
      cVar9 = argv[1][1];
      if (cVar9 != 'n') {
        if (cVar9 == 'w') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Wide API is irrelevant",0x16);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          iVar3 = 0;
          std::ostream::flush();
          goto LAB_001026d6;
        }
        cVar9 = -0x28;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Invalid parameters expected \'-n/-w\'",0x23);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        goto LAB_001024c1;
      }
      iVar3 = setenv("NOWIDE_TEST",local_228._M_dataplus._M_p,1);
      if (iVar3 != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "Error nowide::setenv(\"NOWIDE_TEST\",example.c_str(),1) == 0 in ",0x3e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_268._M_dataplus._M_p._0_1_ = 0x3a;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_268,1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x41);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,(string *)&local_268);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar3 = setenv("NOWIDE_TEST_NONE",local_228._M_dataplus._M_p,1);
      if (iVar3 != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "Error nowide::setenv(\"NOWIDE_TEST_NONE\",example.c_str(),1) == 0 in ",0x43);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_268._M_dataplus._M_p._0_1_ = 0x3a;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_268,1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x42);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,(string *)&local_268);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar3 = unsetenv("NOWIDE_TEST_NONE");
      if (iVar3 != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error nowide::unsetenv(\"NOWIDE_TEST_NONE\") == 0 in ",0x33
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_268._M_dataplus._M_p._0_1_ = 0x3a;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_268,1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x43);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,(string *)&local_268);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"\"","");
      std::__cxx11::string::append((char *)&local_268);
      std::__cxx11::string::append((char *)&local_268);
      std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_228._M_dataplus._M_p);
      iVar3 = system(local_268._M_dataplus._M_p);
      if (iVar3 != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error nowide::system(command.c_str()) == 0 in ",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_248[0] = (long *)CONCAT71(local_248[0]._1_7_,0x3a);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_248,1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x4d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,(string *)local_248);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Parent ok",9);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
LAB_001026c7:
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_228);
      if (iVar3 != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error argv[1]==example in ",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_268._M_dataplus._M_p._0_1_ = 0x3a;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_268,1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,(string *)&local_268);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (argv[2] != (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error argv[2] == 0 in ",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_268._M_dataplus._M_p._0_1_ = 0x3a;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_268,1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,(string *)&local_268);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar4 = getenv("NOWIDE_TEST");
      if (pcVar4 == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error nowide::getenv(\"NOWIDE_TEST\") in ",0x27);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_268._M_dataplus._M_p._0_1_ = 0x3a;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_268,1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,(string *)&local_268);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar4 = getenv("NOWIDE_TEST_NONE");
      if (pcVar4 != (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error nowide::getenv(\"NOWIDE_TEST_NONE\") == 0 in ",0x31);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_268._M_dataplus._M_p._0_1_ = 0x3a;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_268,1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,(string *)&local_268);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_228);
      if (iVar3 != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error nowide::getenv(\"NOWIDE_TEST\")==example in ",0x30);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_268._M_dataplus._M_p._0_1_ = 0x3a;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_268,1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,(string *)&local_268);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::operator+(&local_268,"NOWIDE_TEST=",&local_228);
      pcVar4 = *env;
      if (pcVar4 == (char *)0x0) {
LAB_00102af3:
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error found in ",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_248[0] = (long *)CONCAT71(local_248[0]._1_7_,0x3a);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_248,1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,(string *)local_248);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      ppcVar10 = env + 1;
      bVar2 = 0;
      do {
        bVar1 = bVar2;
        pcVar5 = strchr(pcVar4,0x3d);
        if (pcVar5 == (char *)0x0) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error key_end in ",0x11);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                     ,100);
          local_248[0] = (long *)CONCAT71(local_248[0]._1_7_,0x3a);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_248,1);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x24);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar8,(string *)local_248);
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_248[0] = local_238;
        std::__cxx11::string::_M_construct<char*>((string *)local_248,pcVar4,pcVar5);
        local_1e8[0] = local_1d8;
        sVar6 = strlen(pcVar5 + 1);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,pcVar5 + 1,pcVar5 + sVar6 + 1);
        pcVar4 = getenv((char *)local_248[0]);
        if (pcVar4 == (char *)0x0) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error nowide::getenv(key.c_str()) in ",0x25);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                     ,100);
          local_208[0] = (string)0x3a;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_208,1);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x27);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar8,local_208);
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar3 = std::__cxx11::string::compare((char *)local_1e8);
        if (iVar3 != 0) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error nowide::getenv(key.c_str()) == value in ",0x2e);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                     ,100);
          local_208[0] = (string)0x3a;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_208,1);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x28);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"main",4);
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar8,local_208);
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_268);
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        if (local_248[0] != local_238) {
          operator_delete(local_248[0],local_238[0] + 1);
        }
        pcVar4 = *ppcVar10;
        ppcVar10 = ppcVar10 + 1;
        bVar2 = bVar1 | iVar3 == 0;
      } while (pcVar4 != (char *)0x0);
      if (!(bool)(bVar1 | iVar3 == 0)) goto LAB_00102af3;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Subprocess ok",0xd);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) goto LAB_001026c7;
    }
    iVar3 = 0;
  }
  else {
    cVar9 = 'p';
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Invalid parameters",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
LAB_001024c1:
    std::ostream::put(cVar9);
    iVar3 = 1;
    std::ostream::flush();
  }
LAB_001026d6:
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  return iVar3;
}

Assistant:

int main(int argc,char **argv,char **env)
{
    try {
        std::string example = "\xd7\xa9-\xd0\xbc-\xce\xbd";
        std::wstring wexample = L"\u05e9-\u043c-\u03bd";
        nowide::args a(argc,argv,env);
        if(argc==2 && argv[1][0]!='-') {
            TEST(argv[1]==example);
            TEST(argv[2] == 0);
            TEST(nowide::getenv("NOWIDE_TEST"));
            TEST(nowide::getenv("NOWIDE_TEST_NONE") == 0);
            TEST(nowide::getenv("NOWIDE_TEST")==example);
            std::string sample = "NOWIDE_TEST=" + example;
            bool found = false;
            for(char **e=env;*e!=0;e++) {
				char *eptr = *e;
				//printf("%s\n",eptr);
                char *key_end = strchr(eptr,'=');
                TEST(key_end);
                std::string key = std::string(eptr,key_end);
                std::string value = key_end + 1;
		        TEST(nowide::getenv(key.c_str()));
                TEST(nowide::getenv(key.c_str()) == value);
                if(*e == sample)
                    found = true;
            }
            TEST(found);
            std::cout << "Subprocess ok" << std::endl;
        }
        else if(argc==2 && argv[1][0]=='-') {
            switch(argv[1][1]) {
            case 'w': 
                {
                    #ifdef NOWIDE_WINDOWS
                    std::wstring env = L"NOWIDE_TEST=" + wexample;
                    _wputenv(env.c_str());
                    std::wstring wcommand = nowide::widen(argv[0]);
                    wcommand += L" ";
                    wcommand += wexample;
                    TEST(_wsystem(wcommand.c_str()) == 0);
                    std::cout << "Wide Parent ok" << std::endl;
                    #else
                    std::cout << "Wide API is irrelevant" << std::endl;
                    #endif
                }
                return 0;
            case 'n':
                TEST(nowide::setenv("NOWIDE_TEST",example.c_str(),1) == 0);
                TEST(nowide::setenv("NOWIDE_TEST_NONE",example.c_str(),1) == 0);
                TEST(nowide::unsetenv("NOWIDE_TEST_NONE") == 0);
                break;
            default:
                std::cout << "Invalid parameters expected '-n/-w'" << std::endl;
                return 1;
            }
            std::string command = "\"";
            command += argv[0];
            command += "\" ";
            command += example;
            TEST(nowide::system(command.c_str()) == 0);
            std::cout << "Parent ok" << std::endl;
        }
        else {
            std::cerr << "Invalid parameters" << std::endl;
            return 1;
        }
        return 0;
    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return 1;
    }
}